

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhombicLattice.cpp
# Opt level: O3

void __thiscall RhombicLattice::createFaces(RhombicLattice *this)

{
  Lattice *pLVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  long *plVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  int vertexIndex;
  double dVar10;
  double dVar11;
  cartesian4 cVar12;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<int> __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<int> __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<int> __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<int> __l_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_07;
  initializer_list<int> __l_08;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_09;
  initializer_list<int> __l_10;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_11;
  initializer_list<int> __l_12;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_13;
  initializer_list<int> __l_14;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_15;
  initializer_list<int> __l_16;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_17;
  initializer_list<int> __l_18;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_19;
  initializer_list<int> __l_20;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_21;
  initializer_list<int> __l_22;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_23;
  initializer_list<int> __l_24;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_25;
  initializer_list<int> __l_26;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_27;
  initializer_list<int> __l_28;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_29;
  initializer_list<int> __l_30;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_31;
  initializer_list<int> __l_32;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_33;
  initializer_list<int> __l_34;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_35;
  initializer_list<int> __l_36;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_37;
  initializer_list<int> __l_38;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_39;
  initializer_list<int> __l_40;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_41;
  initializer_list<int> __l_42;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_43;
  initializer_list<int> __l_44;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_45;
  initializer_list<int> __l_46;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_47;
  initializer_list<int> __l_48;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_49;
  initializer_list<int> __l_50;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_51;
  initializer_list<int> __l_52;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_53;
  initializer_list<int> __l_54;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_55;
  initializer_list<int> __l_56;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_57;
  initializer_list<int> __l_58;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_59;
  initializer_list<int> __l_60;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_61;
  initializer_list<int> __l_62;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_63;
  initializer_list<int> __l_64;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_65;
  initializer_list<int> __l_66;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_67;
  initializer_list<int> __l_68;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_69;
  initializer_list<int> __l_70;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_71;
  initializer_list<int> __l_72;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_73;
  initializer_list<int> __l_74;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_75;
  initializer_list<int> __l_76;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_77;
  initializer_list<int> __l_78;
  allocator_type local_23a;
  allocator_type local_239;
  vector<int,_std::allocator<int>_> local_238;
  Lattice *local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  undefined1 *local_1f8 [2];
  undefined1 local_1e8 [16];
  undefined1 *local_1d8 [2];
  undefined1 local_1c8 [16];
  long *local_1b8 [2];
  long local_1a8 [2];
  int local_198 [4];
  double local_188;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_180;
  undefined1 **local_168;
  undefined1 **local_160;
  undefined1 **local_158;
  undefined1 **local_150;
  undefined1 **local_148;
  undefined1 **local_140;
  undefined1 **local_138;
  undefined1 **local_130;
  undefined1 **local_128;
  undefined1 **local_120;
  undefined1 **local_118;
  undefined1 **local_110;
  undefined1 **local_108;
  undefined1 **local_100;
  undefined1 **local_f8;
  undefined1 **local_f0;
  undefined1 **local_e8;
  undefined1 **local_e0;
  undefined1 **local_d8;
  undefined1 **local_d0;
  undefined1 **local_c8;
  undefined1 **local_c0;
  undefined1 **local_b8;
  undefined1 **local_b0;
  undefined1 **local_a8;
  undefined1 **local_a0;
  undefined1 **local_98;
  undefined1 **local_90;
  undefined1 **local_88;
  undefined1 **local_80;
  undefined1 **local_78;
  undefined1 **local_70;
  undefined1 **local_68;
  undefined1 **local_60;
  undefined1 **local_58;
  undefined1 **local_50;
  undefined1 **local_48;
  undefined1 **local_40;
  undefined1 **local_38;
  
  dVar10 = pow((double)(this->super_Lattice).l,3.0);
  if (0.0 < dVar10) {
    local_168 = local_1f8;
    dVar10 = 0.0;
    vertexIndex = 0;
    local_220 = &this->super_Lattice;
    local_160 = local_168;
    local_158 = local_168;
    local_150 = local_168;
    local_148 = local_168;
    local_140 = local_168;
    local_138 = local_168;
    local_130 = local_168;
    local_128 = local_168;
    local_120 = local_168;
    local_118 = local_168;
    local_110 = local_168;
    local_108 = local_168;
    local_100 = local_168;
    local_f8 = local_168;
    local_f0 = local_168;
    local_e8 = local_168;
    local_e0 = local_168;
    local_d8 = local_168;
    local_d0 = local_168;
    local_c8 = local_168;
    local_c0 = local_168;
    local_b8 = local_168;
    local_b0 = local_168;
    local_a8 = local_168;
    local_a0 = local_168;
    local_98 = local_168;
    local_90 = local_168;
    local_88 = local_168;
    local_80 = local_168;
    local_78 = local_168;
    local_70 = local_168;
    local_68 = local_168;
    local_60 = local_168;
    local_58 = local_168;
    local_50 = local_168;
    local_48 = local_168;
    local_40 = local_168;
    local_38 = local_168;
    do {
      cVar12 = Lattice::indexToCoordinate(&this->super_Lattice,vertexIndex);
      pLVar1 = local_220;
      uVar4 = cVar12.z;
      if (uVar4 != 0) {
        uVar3 = cVar12._0_8_ >> 0x20;
        uVar8 = cVar12.x;
        uVar2 = cVar12.y;
        if ((uVar4 + uVar8 + uVar2 & 0x80000001) == 1) {
          iVar9 = SUB84(dVar10,0);
          if ((uVar4 & 0x80000001) == 1) {
            if (uVar3 == 0) {
              local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"xyz","");
              local_1f8[0] = local_1e8;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"xy","");
              pLVar1 = local_220;
              local_1d8[0] = local_1c8;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"xy","");
              local_1b8[0] = local_1a8;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"xyz","");
              __l._M_len = 4;
              __l._M_array = &local_218;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_180,__l,&local_239);
              local_198[0] = 1;
              local_198[1] = 1;
              local_198[2] = 1;
              local_198[3] = 1;
              __l_00._M_len = 4;
              __l_00._M_array = local_198;
              std::vector<int,_std::allocator<int>_>::vector(&local_238,__l_00,&local_23a);
              Lattice::addFace(pLVar1,vertexIndex,iVar9,&local_180,&local_238);
              if (local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_180);
              lVar7 = -0x80;
              plVar6 = local_1a8;
              do {
                if (plVar6 != (long *)plVar6[-2]) {
                  operator_delete((long *)plVar6[-2],*plVar6 + 1);
                }
                plVar6 = plVar6 + -4;
                lVar7 = lVar7 + 0x20;
              } while (lVar7 != 0);
LAB_001267ab:
              dVar10 = (double)(ulong)(iVar9 + 1);
            }
            else if (uVar8 == 0) {
              local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
              local_188 = dVar10;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"xyz","");
              local_1f8[0] = local_1e8;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"xy","");
              local_1d8[0] = local_1c8;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"xy","");
              local_1b8[0] = local_1a8;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"xyz","");
              __l_17._M_len = 4;
              __l_17._M_array = &local_218;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_180,__l_17,&local_239);
              local_198[0] = 1;
              local_198[1] = 1;
              local_198[2] = 1;
              local_198[3] = 1;
              __l_18._M_len = 4;
              __l_18._M_array = local_198;
              std::vector<int,_std::allocator<int>_>::vector(&local_238,__l_18,&local_23a);
              Lattice::addFace(local_220,vertexIndex,SUB84(local_188,0),&local_180,&local_238);
              if (local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_180);
              lVar7 = -0x80;
              plVar6 = local_1a8;
              do {
                if (plVar6 != (long *)plVar6[-2]) {
                  operator_delete((long *)plVar6[-2],*plVar6 + 1);
                }
                plVar6 = plVar6 + -4;
                lVar7 = lVar7 + 0x20;
              } while (lVar7 != 0);
              uVar8 = SUB84(local_188,0) + 1;
              if (local_220->l - 1U != uVar4) {
                local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"xyz","");
                local_1f8[0] = local_1e8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"xz","");
                local_1d8[0] = local_1c8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"xz","");
                local_1b8[0] = local_1a8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"xyz","");
                __l_19._M_len = 4;
                __l_19._M_array = &local_218;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_180,__l_19,&local_239);
                local_198[0] = 1;
                local_198[1] = 1;
                local_198[2] = 1;
                local_198[3] = 1;
                __l_20._M_len = 4;
                __l_20._M_array = local_198;
                std::vector<int,_std::allocator<int>_>::vector(&local_238,__l_20,&local_23a);
                Lattice::addFace(local_220,vertexIndex,uVar8,&local_180,&local_238);
                if (local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_180);
                lVar7 = -0x80;
                plVar6 = local_1a8;
                do {
                  if (plVar6 != (long *)plVar6[-2]) {
                    operator_delete((long *)plVar6[-2],*plVar6 + 1);
                  }
                  plVar6 = plVar6 + -4;
                  lVar7 = lVar7 + 0x20;
                } while (lVar7 != 0);
                uVar8 = SUB84(local_188,0) + 2;
              }
              if (uVar4 != 1) {
                local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"xy","");
                pLVar1 = local_220;
                local_1f8[0] = local_1e8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"yz","");
                local_1d8[0] = local_1c8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"yz","");
                local_1b8[0] = local_1a8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"xy","");
                __l_21._M_len = 4;
                __l_21._M_array = &local_218;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_180,__l_21,&local_239);
                local_198[0] = 1;
                local_198[1] = -1;
                local_198[2] = -1;
                local_198[3] = 1;
                __l_22._M_len = 4;
                __l_22._M_array = local_198;
                std::vector<int,_std::allocator<int>_>::vector(&local_238,__l_22,&local_23a);
                Lattice::addFace(pLVar1,vertexIndex,uVar8,&local_180,&local_238);
                if (local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_180);
                lVar7 = -0x80;
                plVar6 = local_1a8;
                do {
                  if (plVar6 != (long *)plVar6[-2]) {
                    operator_delete((long *)plVar6[-2],*plVar6 + 1);
                  }
                  plVar6 = plVar6 + -4;
                  lVar7 = lVar7 + 0x20;
                } while (lVar7 != 0);
LAB_00126651:
                uVar8 = uVar8 + 1;
              }
LAB_00126654:
              dVar10 = (double)(ulong)uVar8;
            }
            else {
              uVar5 = local_220->l - 1;
              if (uVar5 == uVar8) {
                if (uVar8 != uVar2) {
                  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                  local_188 = dVar10;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"yz","");
                  local_1f8[0] = local_1e8;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"xz","");
                  local_1d8[0] = local_1c8;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"xz","");
                  local_1b8[0] = local_1a8;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"yz","");
                  dVar10 = local_188;
                  __l_07._M_len = 4;
                  __l_07._M_array = &local_218;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector(&local_180,__l_07,&local_239);
                  local_198[0] = 1;
                  local_198[1] = -1;
                  local_198[2] = -1;
                  local_198[3] = 1;
                  __l_08._M_len = 4;
                  __l_08._M_array = local_198;
                  std::vector<int,_std::allocator<int>_>::vector(&local_238,__l_08,&local_23a);
                  Lattice::addFace(local_220,vertexIndex,SUB84(dVar10,0),&local_180,&local_238);
                  if (local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start,
                                    (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start);
                  }
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_180);
                  lVar7 = -0x80;
                  plVar6 = local_1a8;
                  do {
                    if (plVar6 != (long *)plVar6[-2]) {
                      operator_delete((long *)plVar6[-2],*plVar6 + 1);
                    }
                    plVar6 = plVar6 + -4;
                    lVar7 = lVar7 + 0x20;
                  } while (lVar7 != 0);
                  uVar8 = SUB84(local_188,0) + 1;
                  if (local_220->l - 1U != uVar4) {
                    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"xy","");
                    local_1f8[0] = local_1e8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"yz","");
                    local_1d8[0] = local_1c8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"yz","");
                    local_1b8[0] = local_1a8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"xy","");
                    __l_09._M_len = 4;
                    __l_09._M_array = &local_218;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::vector(&local_180,__l_09,&local_239);
                    local_198[0] = -1;
                    local_198[1] = 1;
                    local_198[2] = 1;
                    local_198[3] = -1;
                    __l_10._M_len = 4;
                    __l_10._M_array = local_198;
                    std::vector<int,_std::allocator<int>_>::vector(&local_238,__l_10,&local_23a);
                    Lattice::addFace(local_220,vertexIndex,uVar8,&local_180,&local_238);
                    if (local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_238.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start,
                                      (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start);
                    }
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector(&local_180);
                    lVar7 = -0x80;
                    plVar6 = local_1a8;
                    do {
                      if (plVar6 != (long *)plVar6[-2]) {
                        operator_delete((long *)plVar6[-2],*plVar6 + 1);
                      }
                      plVar6 = plVar6 + -4;
                      lVar7 = lVar7 + 0x20;
                    } while (lVar7 != 0);
                    uVar8 = SUB84(local_188,0) + 2;
                  }
                  if (uVar4 != 1) {
                    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"xyz","");
                    pLVar1 = local_220;
                    local_1f8[0] = local_1e8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"xz","");
                    local_1d8[0] = local_1c8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"xz","");
                    local_1b8[0] = local_1a8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"xyz","");
                    __l_11._M_len = 4;
                    __l_11._M_array = &local_218;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::vector(&local_180,__l_11,&local_239);
                    local_198[0] = -1;
                    local_198[1] = -1;
                    local_198[2] = -1;
                    local_198[3] = -1;
                    __l_12._M_len = 4;
                    __l_12._M_array = local_198;
                    std::vector<int,_std::allocator<int>_>::vector(&local_238,__l_12,&local_23a);
                    Lattice::addFace(pLVar1,vertexIndex,uVar8,&local_180,&local_238);
                    if (local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_238.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start,
                                      (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start);
                    }
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector(&local_180);
                    lVar7 = -0x80;
                    plVar6 = local_1a8;
                    do {
                      if (plVar6 != (long *)plVar6[-2]) {
                        operator_delete((long *)plVar6[-2],*plVar6 + 1);
                      }
                      plVar6 = plVar6 + -4;
                      lVar7 = lVar7 + 0x20;
                    } while (lVar7 != 0);
                    goto LAB_00126651;
                  }
                  goto LAB_00126654;
                }
              }
              else {
                if (uVar5 == uVar2) {
                  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"xz","");
                  local_1f8[0] = local_1e8;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"yz","");
                  pLVar1 = local_220;
                  local_1d8[0] = local_1c8;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"yz","");
                  local_1b8[0] = local_1a8;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"xz","");
                  __l_23._M_len = 4;
                  __l_23._M_array = &local_218;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector(&local_180,__l_23,&local_239);
                  local_198[0] = 1;
                  local_198[1] = -1;
                  local_198[2] = -1;
                  local_198[3] = 1;
                  __l_24._M_len = 4;
                  __l_24._M_array = local_198;
                  std::vector<int,_std::allocator<int>_>::vector(&local_238,__l_24,&local_23a);
                  Lattice::addFace(pLVar1,vertexIndex,iVar9,&local_180,&local_238);
                  if (local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start,
                                    (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start);
                  }
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_180);
                  lVar7 = -0x80;
                  plVar6 = local_1a8;
                  do {
                    if (plVar6 != (long *)plVar6[-2]) {
                      operator_delete((long *)plVar6[-2],*plVar6 + 1);
                    }
                    plVar6 = plVar6 + -4;
                    lVar7 = lVar7 + 0x20;
                  } while (lVar7 != 0);
                  goto LAB_001267ab;
                }
                if (((undefined1  [16])cVar12 & (undefined1  [16])0x100000000) ==
                    (undefined1  [16])0x0 && (int)uVar8 % 2 == 0) {
                  local_188 = dVar10;
                  if (uVar5 != uVar4) {
                    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"xyz","");
                    local_1f8[0] = local_1e8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"xz","");
                    local_1d8[0] = local_1c8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"xz","");
                    local_1b8[0] = local_1a8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"xyz","");
                    __l_59._M_len = 4;
                    __l_59._M_array = &local_218;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::vector(&local_180,__l_59,&local_239);
                    local_198[0] = 1;
                    local_198[1] = 1;
                    local_198[2] = 1;
                    local_198[3] = 1;
                    __l_60._M_len = 4;
                    __l_60._M_array = local_198;
                    std::vector<int,_std::allocator<int>_>::vector(&local_238,__l_60,&local_23a);
                    Lattice::addFace(local_220,vertexIndex,iVar9,&local_180,&local_238);
                    if (local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_238.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start,
                                      (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start);
                    }
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector(&local_180);
                    lVar7 = -0x80;
                    plVar6 = local_1a8;
                    do {
                      if (plVar6 != (long *)plVar6[-2]) {
                        operator_delete((long *)plVar6[-2],*plVar6 + 1);
                      }
                      plVar6 = plVar6 + -4;
                      lVar7 = lVar7 + 0x20;
                    } while (lVar7 != 0);
                    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"xy","");
                    local_1f8[0] = local_1e8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"yz","");
                    local_1d8[0] = local_1c8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"yz","");
                    local_1b8[0] = local_1a8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"xy","");
                    __l_61._M_len = 4;
                    __l_61._M_array = &local_218;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::vector(&local_180,__l_61,&local_239);
                    local_198[0] = -1;
                    local_198[1] = 1;
                    local_198[2] = 1;
                    local_198[3] = -1;
                    __l_62._M_len = 4;
                    __l_62._M_array = local_198;
                    std::vector<int,_std::allocator<int>_>::vector(&local_238,__l_62,&local_23a);
                    Lattice::addFace(local_220,vertexIndex,SUB84(local_188,0) + 1,&local_180,
                                     &local_238);
                    if (local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_238.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start,
                                      (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start);
                    }
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector(&local_180);
                    lVar7 = -0x80;
                    plVar6 = local_1a8;
                    do {
                      if (plVar6 != (long *)plVar6[-2]) {
                        operator_delete((long *)plVar6[-2],*plVar6 + 1);
                      }
                      plVar6 = plVar6 + -4;
                      lVar7 = lVar7 + 0x20;
                    } while (lVar7 != 0);
                    local_188 = (double)(ulong)(SUB84(local_188,0) + 2);
                  }
                  if (uVar4 != 1) {
                    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"xy","");
                    pLVar1 = local_220;
                    local_1f8[0] = local_1e8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"yz","");
                    local_1d8[0] = local_1c8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"yz","");
                    local_1b8[0] = local_1a8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"xy","");
                    dVar10 = local_188;
                    __l_63._M_len = 4;
                    __l_63._M_array = &local_218;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::vector(&local_180,__l_63,&local_239);
                    local_198[0] = 1;
                    local_198[1] = -1;
                    local_198[2] = -1;
                    local_198[3] = 1;
                    __l_64._M_len = 4;
                    __l_64._M_array = local_198;
                    std::vector<int,_std::allocator<int>_>::vector(&local_238,__l_64,&local_23a);
                    iVar9 = SUB84(dVar10,0);
                    Lattice::addFace(pLVar1,vertexIndex,iVar9,&local_180,&local_238);
                    if (local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_238.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start,
                                      (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start);
                    }
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector(&local_180);
                    lVar7 = -0x80;
                    plVar6 = local_1a8;
                    do {
                      if (plVar6 != (long *)plVar6[-2]) {
                        operator_delete((long *)plVar6[-2],*plVar6 + 1);
                      }
                      plVar6 = plVar6 + -4;
                      lVar7 = lVar7 + 0x20;
                    } while (lVar7 != 0);
                    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"xyz","");
                    local_1f8[0] = local_1e8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"xz","");
                    pLVar1 = local_220;
                    local_1d8[0] = local_1c8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"xz","");
                    local_1b8[0] = local_1a8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"xyz","");
                    __l_65._M_len = 4;
                    __l_65._M_array = &local_218;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::vector(&local_180,__l_65,&local_239);
                    local_198[0] = -1;
                    local_198[1] = -1;
                    local_198[2] = -1;
                    local_198[3] = -1;
                    __l_66._M_len = 4;
                    __l_66._M_array = local_198;
                    std::vector<int,_std::allocator<int>_>::vector(&local_238,__l_66,&local_23a);
                    Lattice::addFace(pLVar1,vertexIndex,iVar9 + 1,&local_180,&local_238);
                    if (local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_238.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start,
                                      (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start);
                    }
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector(&local_180);
                    lVar7 = -0x80;
                    plVar6 = local_1a8;
                    do {
                      if (plVar6 != (long *)plVar6[-2]) {
                        operator_delete((long *)plVar6[-2],*plVar6 + 1);
                      }
                      plVar6 = plVar6 + -4;
                      lVar7 = lVar7 + 0x20;
                    } while (lVar7 != 0);
                    local_188 = (double)(ulong)(iVar9 + 2);
                  }
                  pLVar1 = local_220;
                  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"xyz","");
                  local_1f8[0] = local_1e8;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"xy","");
                  local_1d8[0] = local_1c8;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"xy","");
                  local_1b8[0] = local_1a8;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"xyz","");
                  dVar10 = local_188;
                  __l_67._M_len = 4;
                  __l_67._M_array = &local_218;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector(&local_180,__l_67,&local_239);
                  local_198[0] = 1;
                  local_198[1] = 1;
                  local_198[2] = 1;
                  local_198[3] = 1;
                  __l_68._M_len = 4;
                  __l_68._M_array = local_198;
                  std::vector<int,_std::allocator<int>_>::vector(&local_238,__l_68,&local_23a);
                  Lattice::addFace(pLVar1,vertexIndex,SUB84(dVar10,0),&local_180,&local_238);
                  if (local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start,
                                    (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start);
                  }
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_180);
                  lVar7 = -0x80;
                  plVar6 = local_1a8;
                  do {
                    if (plVar6 != (long *)plVar6[-2]) {
                      operator_delete((long *)plVar6[-2],*plVar6 + 1);
                    }
                    plVar6 = plVar6 + -4;
                    lVar7 = lVar7 + 0x20;
                  } while (lVar7 != 0);
                  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"xyz","");
                  local_1f8[0] = local_1e8;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"xy","");
                  pLVar1 = local_220;
                  local_1d8[0] = local_1c8;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"xy","");
                  local_1b8[0] = local_1a8;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"xyz","");
                  __l_69._M_len = 4;
                  __l_69._M_array = &local_218;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector(&local_180,__l_69,&local_239);
                  iVar9 = SUB84(local_188,0);
                  local_198[0] = -1;
                  local_198[1] = -1;
                  local_198[2] = -1;
                  local_198[3] = -1;
                  __l_70._M_len = 4;
                  __l_70._M_array = local_198;
                  std::vector<int,_std::allocator<int>_>::vector(&local_238,__l_70,&local_23a);
                  Lattice::addFace(pLVar1,vertexIndex,iVar9 + 1,&local_180,&local_238);
                  if (local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start,
                                    (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start);
                  }
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_180);
                  lVar7 = -0x80;
                  plVar6 = local_1a8;
                  do {
                    if (plVar6 != (long *)plVar6[-2]) {
                      operator_delete((long *)plVar6[-2],*plVar6 + 1);
                    }
                    plVar6 = plVar6 + -4;
                    lVar7 = lVar7 + 0x20;
                  } while (lVar7 != 0);
                }
                else {
                  if ((uVar2 & 0x80000001) != 1 || (int)uVar8 % 2 != 1) goto LAB_00126eb1;
                  local_188 = dVar10;
                  if (uVar5 != uVar4) {
                    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"xyz","");
                    local_1f8[0] = local_1e8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"xz","");
                    local_1d8[0] = local_1c8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"xz","");
                    local_1b8[0] = local_1a8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"xyz","");
                    __l_31._M_len = 4;
                    __l_31._M_array = &local_218;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::vector(&local_180,__l_31,&local_239);
                    local_198[0] = 1;
                    local_198[1] = 1;
                    local_198[2] = 1;
                    local_198[3] = 1;
                    __l_32._M_len = 4;
                    __l_32._M_array = local_198;
                    std::vector<int,_std::allocator<int>_>::vector(&local_238,__l_32,&local_23a);
                    Lattice::addFace(local_220,vertexIndex,iVar9,&local_180,&local_238);
                    if (local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_238.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start,
                                      (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start);
                    }
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector(&local_180);
                    lVar7 = -0x80;
                    plVar6 = local_1a8;
                    do {
                      if (plVar6 != (long *)plVar6[-2]) {
                        operator_delete((long *)plVar6[-2],*plVar6 + 1);
                      }
                      plVar6 = plVar6 + -4;
                      lVar7 = lVar7 + 0x20;
                    } while (lVar7 != 0);
                    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"xy","");
                    local_1f8[0] = local_1e8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"yz","");
                    local_1d8[0] = local_1c8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"yz","");
                    local_1b8[0] = local_1a8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"xy","");
                    __l_33._M_len = 4;
                    __l_33._M_array = &local_218;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::vector(&local_180,__l_33,&local_239);
                    local_198[0] = -1;
                    local_198[1] = 1;
                    local_198[2] = 1;
                    local_198[3] = -1;
                    __l_34._M_len = 4;
                    __l_34._M_array = local_198;
                    std::vector<int,_std::allocator<int>_>::vector(&local_238,__l_34,&local_23a);
                    Lattice::addFace(local_220,vertexIndex,SUB84(local_188,0) + 1,&local_180,
                                     &local_238);
                    if (local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_238.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start,
                                      (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start);
                    }
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector(&local_180);
                    lVar7 = -0x80;
                    plVar6 = local_1a8;
                    do {
                      if (plVar6 != (long *)plVar6[-2]) {
                        operator_delete((long *)plVar6[-2],*plVar6 + 1);
                      }
                      plVar6 = plVar6 + -4;
                      lVar7 = lVar7 + 0x20;
                    } while (lVar7 != 0);
                    local_188 = (double)(ulong)(SUB84(local_188,0) + 2);
                  }
                  if (uVar4 == 1) {
                    iVar9 = SUB84(local_188,0);
                  }
                  else {
                    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"xy","");
                    pLVar1 = local_220;
                    local_1f8[0] = local_1e8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"yz","");
                    local_1d8[0] = local_1c8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"yz","");
                    local_1b8[0] = local_1a8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"xy","");
                    dVar10 = local_188;
                    __l_71._M_len = 4;
                    __l_71._M_array = &local_218;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::vector(&local_180,__l_71,&local_239);
                    local_198[0] = 1;
                    local_198[1] = -1;
                    local_198[2] = -1;
                    local_198[3] = 1;
                    __l_72._M_len = 4;
                    __l_72._M_array = local_198;
                    std::vector<int,_std::allocator<int>_>::vector(&local_238,__l_72,&local_23a);
                    iVar9 = SUB84(dVar10,0);
                    Lattice::addFace(pLVar1,vertexIndex,iVar9,&local_180,&local_238);
                    if (local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_238.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start,
                                      (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start);
                    }
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector(&local_180);
                    lVar7 = -0x80;
                    plVar6 = local_1a8;
                    do {
                      if (plVar6 != (long *)plVar6[-2]) {
                        operator_delete((long *)plVar6[-2],*plVar6 + 1);
                      }
                      plVar6 = plVar6 + -4;
                      lVar7 = lVar7 + 0x20;
                    } while (lVar7 != 0);
                    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"xyz","");
                    local_1f8[0] = local_1e8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"xz","");
                    pLVar1 = local_220;
                    local_1d8[0] = local_1c8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"xz","");
                    local_1b8[0] = local_1a8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"xyz","");
                    __l_73._M_len = 4;
                    __l_73._M_array = &local_218;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::vector(&local_180,__l_73,&local_239);
                    local_198[0] = -1;
                    local_198[1] = -1;
                    local_198[2] = -1;
                    local_198[3] = -1;
                    __l_74._M_len = 4;
                    __l_74._M_array = local_198;
                    std::vector<int,_std::allocator<int>_>::vector(&local_238,__l_74,&local_23a);
                    Lattice::addFace(pLVar1,vertexIndex,iVar9 + 1,&local_180,&local_238);
                    if (local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_238.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start,
                                      (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start);
                    }
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector(&local_180);
                    lVar7 = -0x80;
                    plVar6 = local_1a8;
                    do {
                      if (plVar6 != (long *)plVar6[-2]) {
                        operator_delete((long *)plVar6[-2],*plVar6 + 1);
                      }
                      plVar6 = plVar6 + -4;
                      lVar7 = lVar7 + 0x20;
                    } while (lVar7 != 0);
                    iVar9 = iVar9 + 2;
                  }
                  pLVar1 = local_220;
                  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"xz","");
                  local_1f8[0] = local_1e8;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"yz","");
                  local_1d8[0] = local_1c8;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"yz","");
                  local_1b8[0] = local_1a8;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"xz","");
                  __l_75._M_len = 4;
                  __l_75._M_array = &local_218;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector(&local_180,__l_75,&local_239);
                  local_198[0] = 1;
                  local_198[1] = -1;
                  local_198[2] = -1;
                  local_198[3] = 1;
                  __l_76._M_len = 4;
                  __l_76._M_array = local_198;
                  std::vector<int,_std::allocator<int>_>::vector(&local_238,__l_76,&local_23a);
                  Lattice::addFace(pLVar1,vertexIndex,iVar9,&local_180,&local_238);
                  if (local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start,
                                    (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start);
                  }
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_180);
                  lVar7 = -0x80;
                  plVar6 = local_1a8;
                  do {
                    if (plVar6 != (long *)plVar6[-2]) {
                      operator_delete((long *)plVar6[-2],*plVar6 + 1);
                    }
                    plVar6 = plVar6 + -4;
                    lVar7 = lVar7 + 0x20;
                  } while (lVar7 != 0);
                  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"xz","");
                  local_1f8[0] = local_1e8;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"yz","");
                  pLVar1 = local_220;
                  local_1d8[0] = local_1c8;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"yz","");
                  local_1b8[0] = local_1a8;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"xz","");
                  __l_77._M_len = 4;
                  __l_77._M_array = &local_218;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector(&local_180,__l_77,&local_239);
                  local_198[0] = -1;
                  local_198[1] = 1;
                  local_198[2] = 1;
                  local_198[3] = -1;
                  __l_78._M_len = 4;
                  __l_78._M_array = local_198;
                  std::vector<int,_std::allocator<int>_>::vector(&local_238,__l_78,&local_23a);
                  Lattice::addFace(pLVar1,vertexIndex,iVar9 + 1,&local_180,&local_238);
                  if (local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start,
                                    (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start);
                  }
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_180);
                  lVar7 = -0x80;
                  plVar6 = local_1a8;
                  do {
                    if (plVar6 != (long *)plVar6[-2]) {
                      operator_delete((long *)plVar6[-2],*plVar6 + 1);
                    }
                    plVar6 = plVar6 + -4;
                    lVar7 = lVar7 + 0x20;
                  } while (lVar7 != 0);
                }
                dVar10 = (double)(ulong)(iVar9 + 2);
              }
            }
          }
          else {
            if (uVar8 == 0) {
              local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"xz","");
              pLVar1 = local_220;
              local_1f8[0] = local_1e8;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"yz","");
              local_1d8[0] = local_1c8;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"yz","");
              local_1b8[0] = local_1a8;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"xz","");
              __l_13._M_len = 4;
              __l_13._M_array = &local_218;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_180,__l_13,&local_239);
              local_198[0] = 1;
              local_198[1] = -1;
              local_198[2] = -1;
              local_198[3] = 1;
              __l_14._M_len = 4;
              __l_14._M_array = local_198;
              std::vector<int,_std::allocator<int>_>::vector(&local_238,__l_14,&local_23a);
              Lattice::addFace(pLVar1,vertexIndex,iVar9,&local_180,&local_238);
              if (local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_180);
              lVar7 = -0x80;
              plVar6 = local_1a8;
              do {
                if (plVar6 != (long *)plVar6[-2]) {
                  operator_delete((long *)plVar6[-2],*plVar6 + 1);
                }
                plVar6 = plVar6 + -4;
                lVar7 = lVar7 + 0x20;
              } while (lVar7 != 0);
              goto LAB_001267ab;
            }
            uVar4 = local_220->l - 1;
            if (uVar3 == 0) {
              if (uVar4 != uVar8) {
                local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                local_188 = dVar10;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"xyz","");
                local_1f8[0] = local_1e8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"xy","");
                local_1d8[0] = local_1c8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"xy","");
                local_1b8[0] = local_1a8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"xyz","");
                __l_01._M_len = 4;
                __l_01._M_array = &local_218;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_180,__l_01,&local_239);
                dVar10 = local_188;
                local_198[0] = 1;
                local_198[1] = 1;
                local_198[2] = 1;
                local_198[3] = 1;
                __l_02._M_len = 4;
                __l_02._M_array = local_198;
                std::vector<int,_std::allocator<int>_>::vector(&local_238,__l_02,&local_23a);
                Lattice::addFace(pLVar1,vertexIndex,SUB84(dVar10,0),&local_180,&local_238);
                if (local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_180);
                lVar7 = -0x80;
                plVar6 = local_1a8;
                do {
                  if (plVar6 != (long *)plVar6[-2]) {
                    operator_delete((long *)plVar6[-2],*plVar6 + 1);
                  }
                  plVar6 = plVar6 + -4;
                  lVar7 = lVar7 + 0x20;
                } while (lVar7 != 0);
                local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"xyz","");
                local_1f8[0] = local_1e8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"yz","");
                pLVar1 = local_220;
                local_1d8[0] = local_1c8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"yz","");
                local_1b8[0] = local_1a8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"xyz","");
                __l_03._M_len = 4;
                __l_03._M_array = &local_218;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_180,__l_03,&local_239);
                local_198[0] = 1;
                local_198[1] = 1;
                local_198[2] = 1;
                local_198[3] = 1;
                __l_04._M_len = 4;
                __l_04._M_array = local_198;
                std::vector<int,_std::allocator<int>_>::vector(&local_238,__l_04,&local_23a);
                Lattice::addFace(pLVar1,vertexIndex,SUB84(dVar10,0) + 1,&local_180,&local_238);
                if (local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_180);
                lVar7 = -0x80;
                plVar6 = local_1a8;
                do {
                  if (plVar6 != (long *)plVar6[-2]) {
                    operator_delete((long *)plVar6[-2],*plVar6 + 1);
                  }
                  plVar6 = plVar6 + -4;
                  lVar7 = lVar7 + 0x20;
                } while (lVar7 != 0);
                local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"xy","");
                local_1f8[0] = local_1e8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"xz","");
                pLVar1 = local_220;
                local_1d8[0] = local_1c8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"xz","");
                local_1b8[0] = local_1a8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"xy","");
                dVar10 = local_188;
                __l_05._M_len = 4;
                __l_05._M_array = &local_218;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_180,__l_05,&local_239);
                local_198[0] = 1;
                local_198[1] = -1;
                local_198[2] = -1;
                local_198[3] = 1;
                __l_06._M_len = 4;
                __l_06._M_array = local_198;
                std::vector<int,_std::allocator<int>_>::vector(&local_238,__l_06,&local_23a);
                Lattice::addFace(pLVar1,vertexIndex,SUB84(dVar10,0) + 2,&local_180,&local_238);
                if (local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_180);
                lVar7 = -0x80;
                plVar6 = local_1a8;
                do {
                  if (plVar6 != (long *)plVar6[-2]) {
                    operator_delete((long *)plVar6[-2],*plVar6 + 1);
                  }
                  plVar6 = plVar6 + -4;
                  lVar7 = lVar7 + 0x20;
                } while (lVar7 != 0);
LAB_00126b9f:
                dVar10 = (double)(ulong)(SUB84(dVar10,0) + 3);
              }
            }
            else {
              if (uVar4 == uVar8) {
                local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"xyz","");
                local_1f8[0] = local_1e8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"xy","");
                local_1d8[0] = local_1c8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"xy","");
                local_1b8[0] = local_1a8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"xyz","");
                __l_15._M_len = 4;
                __l_15._M_array = &local_218;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_180,__l_15,&local_239);
                local_198[0] = -1;
                local_198[1] = -1;
                local_198[2] = -1;
                local_198[3] = -1;
                __l_16._M_len = 4;
                __l_16._M_array = local_198;
                std::vector<int,_std::allocator<int>_>::vector(&local_238,__l_16,&local_23a);
                Lattice::addFace(pLVar1,vertexIndex,iVar9,&local_180,&local_238);
                if (local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_180);
                lVar7 = -0x80;
                plVar6 = local_1a8;
                do {
                  if (plVar6 != (long *)plVar6[-2]) {
                    operator_delete((long *)plVar6[-2],*plVar6 + 1);
                  }
                  plVar6 = plVar6 + -4;
                  lVar7 = lVar7 + 0x20;
                } while (lVar7 != 0);
                goto LAB_001267ab;
              }
              if (uVar4 == uVar2) {
                local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"xz","");
                local_1f8[0] = local_1e8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"yz","");
                local_1d8[0] = local_1c8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"yz","");
                local_1b8[0] = local_1a8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"xz","");
                __l_25._M_len = 4;
                __l_25._M_array = &local_218;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_180,__l_25,&local_239);
                local_198[0] = 1;
                local_198[1] = -1;
                local_198[2] = -1;
                local_198[3] = 1;
                __l_26._M_len = 4;
                __l_26._M_array = local_198;
                std::vector<int,_std::allocator<int>_>::vector(&local_238,__l_26,&local_23a);
                Lattice::addFace(pLVar1,vertexIndex,iVar9,&local_180,&local_238);
                if (local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_180);
                lVar7 = -0x80;
                plVar6 = local_1a8;
                do {
                  if (plVar6 != (long *)plVar6[-2]) {
                    operator_delete((long *)plVar6[-2],*plVar6 + 1);
                  }
                  plVar6 = plVar6 + -4;
                  lVar7 = lVar7 + 0x20;
                } while (lVar7 != 0);
                local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"xy","");
                local_1f8[0] = local_1e8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"xz","");
                local_1d8[0] = local_1c8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"xz","");
                local_1b8[0] = local_1a8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"xy","");
                __l_27._M_len = 4;
                __l_27._M_array = &local_218;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_180,__l_27,&local_239);
                local_198[0] = -1;
                local_198[1] = 1;
                local_198[2] = 1;
                local_198[3] = -1;
                __l_28._M_len = 4;
                __l_28._M_array = local_198;
                std::vector<int,_std::allocator<int>_>::vector(&local_238,__l_28,&local_23a);
                Lattice::addFace(local_220,vertexIndex,iVar9 + 1,&local_180,&local_238);
                if (local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_180);
                lVar7 = -0x80;
                plVar6 = local_1a8;
                do {
                  if (plVar6 != (long *)plVar6[-2]) {
                    operator_delete((long *)plVar6[-2],*plVar6 + 1);
                  }
                  plVar6 = plVar6 + -4;
                  lVar7 = lVar7 + 0x20;
                } while (lVar7 != 0);
                local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"xyz","");
                local_1f8[0] = local_1e8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"yz","");
                pLVar1 = local_220;
                local_1d8[0] = local_1c8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"yz","");
                local_1b8[0] = local_1a8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"xyz","");
                __l_29._M_len = 4;
                __l_29._M_array = &local_218;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_180,__l_29,&local_239);
                local_198[0] = -1;
                local_198[1] = -1;
                local_198[2] = -1;
                local_198[3] = -1;
                __l_30._M_len = 4;
                __l_30._M_array = local_198;
                std::vector<int,_std::allocator<int>_>::vector(&local_238,__l_30,&local_23a);
                Lattice::addFace(pLVar1,vertexIndex,iVar9 + 2,&local_180,&local_238);
                if (local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_180);
                lVar7 = -0x80;
                plVar6 = local_1a8;
                do {
                  if (plVar6 != (long *)plVar6[-2]) {
                    operator_delete((long *)plVar6[-2],*plVar6 + 1);
                  }
                  plVar6 = plVar6 + -4;
                  lVar7 = lVar7 + 0x20;
                } while (lVar7 != 0);
                goto LAB_00126b9f;
              }
              if ((uVar2 & 0x80000001) == 1 && (int)uVar8 % 2 == 0) {
                local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                local_188 = dVar10;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"xz","");
                local_1f8[0] = local_1e8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"xy","");
                local_1d8[0] = local_1c8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"xy","");
                local_1b8[0] = local_1a8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"xz","");
                __l_35._M_len = 4;
                __l_35._M_array = &local_218;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_180,__l_35,&local_239);
                local_198[0] = 1;
                local_198[1] = -1;
                local_198[2] = -1;
                local_198[3] = 1;
                __l_36._M_len = 4;
                __l_36._M_array = local_198;
                std::vector<int,_std::allocator<int>_>::vector(&local_238,__l_36,&local_23a);
                Lattice::addFace(pLVar1,vertexIndex,SUB84(local_188,0),&local_180,&local_238);
                if (local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_180);
                lVar7 = -0x80;
                plVar6 = local_1a8;
                do {
                  if (plVar6 != (long *)plVar6[-2]) {
                    operator_delete((long *)plVar6[-2],*plVar6 + 1);
                  }
                  plVar6 = plVar6 + -4;
                  lVar7 = lVar7 + 0x20;
                } while (lVar7 != 0);
                local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"xyz","");
                local_1f8[0] = local_1e8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"yz","");
                pLVar1 = local_220;
                local_1d8[0] = local_1c8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"yz","");
                local_1b8[0] = local_1a8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"xyz","");
                __l_37._M_len = 4;
                __l_37._M_array = &local_218;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_180,__l_37,&local_239);
                local_198[0] = -1;
                local_198[1] = -1;
                local_198[2] = -1;
                local_198[3] = -1;
                __l_38._M_len = 4;
                __l_38._M_array = local_198;
                std::vector<int,_std::allocator<int>_>::vector(&local_238,__l_38,&local_23a);
                Lattice::addFace(pLVar1,vertexIndex,SUB84(local_188,0) + 1,&local_180,&local_238);
                if (local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_180);
                lVar7 = -0x80;
                plVar6 = local_1a8;
                do {
                  if (plVar6 != (long *)plVar6[-2]) {
                    operator_delete((long *)plVar6[-2],*plVar6 + 1);
                  }
                  plVar6 = plVar6 + -4;
                  lVar7 = lVar7 + 0x20;
                } while (lVar7 != 0);
                local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"xyz","");
                local_1f8[0] = local_1e8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"yz","");
                pLVar1 = local_220;
                local_1d8[0] = local_1c8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"yz","");
                local_1b8[0] = local_1a8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"xyz","");
                __l_39._M_len = 4;
                __l_39._M_array = &local_218;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_180,__l_39,&local_239);
                local_198[0] = 1;
                local_198[1] = 1;
                local_198[2] = 1;
                local_198[3] = 1;
                __l_40._M_len = 4;
                __l_40._M_array = local_198;
                std::vector<int,_std::allocator<int>_>::vector(&local_238,__l_40,&local_23a);
                Lattice::addFace(pLVar1,vertexIndex,SUB84(local_188,0) + 2,&local_180,&local_238);
                if (local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_180);
                lVar7 = -0x80;
                plVar6 = local_1a8;
                do {
                  if (plVar6 != (long *)plVar6[-2]) {
                    operator_delete((long *)plVar6[-2],*plVar6 + 1);
                  }
                  plVar6 = plVar6 + -4;
                  lVar7 = lVar7 + 0x20;
                } while (lVar7 != 0);
                local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"xz","");
                local_1f8[0] = local_1e8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"xy","");
                pLVar1 = local_220;
                local_1d8[0] = local_1c8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"xy","");
                local_1b8[0] = local_1a8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"xz","");
                __l_41._M_len = 4;
                __l_41._M_array = &local_218;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_180,__l_41,&local_239);
                iVar9 = SUB84(local_188,0);
                local_198[0] = -1;
                local_198[1] = 1;
                local_198[2] = 1;
                local_198[3] = -1;
                __l_42._M_len = 4;
                __l_42._M_array = local_198;
                std::vector<int,_std::allocator<int>_>::vector(&local_238,__l_42,&local_23a);
                Lattice::addFace(pLVar1,vertexIndex,iVar9 + 3,&local_180,&local_238);
                if (local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_180);
                lVar7 = -0x80;
                plVar6 = local_1a8;
                do {
                  if (plVar6 != (long *)plVar6[-2]) {
                    operator_delete((long *)plVar6[-2],*plVar6 + 1);
                  }
                  plVar6 = plVar6 + -4;
                  lVar7 = lVar7 + 0x20;
                } while (lVar7 != 0);
                local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"xz","");
                local_1f8[0] = local_1e8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"yz","");
                pLVar1 = local_220;
                local_1d8[0] = local_1c8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"yz","");
                local_1b8[0] = local_1a8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"xz","");
                __l_43._M_len = 4;
                __l_43._M_array = &local_218;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_180,__l_43,&local_239);
                local_198[0] = 1;
                local_198[1] = -1;
                local_198[2] = -1;
                local_198[3] = 1;
                __l_44._M_len = 4;
                __l_44._M_array = local_198;
                std::vector<int,_std::allocator<int>_>::vector(&local_238,__l_44,&local_23a);
                Lattice::addFace(pLVar1,vertexIndex,iVar9 + 4,&local_180,&local_238);
                if (local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_180);
                lVar7 = -0x80;
                plVar6 = local_1a8;
                do {
                  if (plVar6 != (long *)plVar6[-2]) {
                    operator_delete((long *)plVar6[-2],*plVar6 + 1);
                  }
                  plVar6 = plVar6 + -4;
                  lVar7 = lVar7 + 0x20;
                } while (lVar7 != 0);
                local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"xz","");
                local_1f8[0] = local_1e8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"yz","");
                pLVar1 = local_220;
                local_1d8[0] = local_1c8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"yz","");
                local_1b8[0] = local_1a8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"xz","");
                __l_45._M_len = 4;
                __l_45._M_array = &local_218;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_180,__l_45,&local_239);
                local_198[0] = -1;
                local_198[1] = 1;
                local_198[2] = 1;
                local_198[3] = -1;
                __l_46._M_len = 4;
                __l_46._M_array = local_198;
                std::vector<int,_std::allocator<int>_>::vector(&local_238,__l_46,&local_23a);
                Lattice::addFace(pLVar1,vertexIndex,iVar9 + 5,&local_180,&local_238);
                if (local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_180);
                lVar7 = -0x80;
                plVar6 = local_1a8;
                do {
                  if (plVar6 != (long *)plVar6[-2]) {
                    operator_delete((long *)plVar6[-2],*plVar6 + 1);
                  }
                  plVar6 = plVar6 + -4;
                  lVar7 = lVar7 + 0x20;
                } while (lVar7 != 0);
              }
              else {
                if (((undefined1  [16])cVar12 & (undefined1  [16])0x100000000) !=
                    (undefined1  [16])0x0 || (int)uVar8 % 2 != 1) goto LAB_00126eb1;
                local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"xyz","");
                local_1f8[0] = local_1e8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"yz","");
                local_1d8[0] = local_1c8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"yz","");
                local_1b8[0] = local_1a8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"xyz","");
                __l_47._M_len = 4;
                __l_47._M_array = &local_218;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_180,__l_47,&local_239);
                local_198[0] = 1;
                local_198[1] = 1;
                local_198[2] = 1;
                local_198[3] = 1;
                __l_48._M_len = 4;
                __l_48._M_array = local_198;
                std::vector<int,_std::allocator<int>_>::vector(&local_238,__l_48,&local_23a);
                Lattice::addFace(pLVar1,vertexIndex,iVar9,&local_180,&local_238);
                if (local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_180);
                lVar7 = -0x80;
                plVar6 = local_1a8;
                do {
                  if (plVar6 != (long *)plVar6[-2]) {
                    operator_delete((long *)plVar6[-2],*plVar6 + 1);
                  }
                  plVar6 = plVar6 + -4;
                  lVar7 = lVar7 + 0x20;
                } while (lVar7 != 0);
                local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                local_188 = dVar10;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"xz","");
                local_1f8[0] = local_1e8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"xy","");
                pLVar1 = local_220;
                local_1d8[0] = local_1c8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"xy","");
                local_1b8[0] = local_1a8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"xz","");
                __l_49._M_len = 4;
                __l_49._M_array = &local_218;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_180,__l_49,&local_239);
                local_198[0] = -1;
                local_198[1] = 1;
                local_198[2] = 1;
                local_198[3] = -1;
                __l_50._M_len = 4;
                __l_50._M_array = local_198;
                std::vector<int,_std::allocator<int>_>::vector(&local_238,__l_50,&local_23a);
                Lattice::addFace(pLVar1,vertexIndex,SUB84(local_188,0) + 1,&local_180,&local_238);
                if (local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_180);
                lVar7 = -0x80;
                plVar6 = local_1a8;
                do {
                  if (plVar6 != (long *)plVar6[-2]) {
                    operator_delete((long *)plVar6[-2],*plVar6 + 1);
                  }
                  plVar6 = plVar6 + -4;
                  lVar7 = lVar7 + 0x20;
                } while (lVar7 != 0);
                local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"xz","");
                local_1f8[0] = local_1e8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"xy","");
                pLVar1 = local_220;
                local_1d8[0] = local_1c8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"xy","");
                local_1b8[0] = local_1a8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"xz","");
                __l_51._M_len = 4;
                __l_51._M_array = &local_218;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_180,__l_51,&local_239);
                local_198[0] = 1;
                local_198[1] = -1;
                local_198[2] = -1;
                local_198[3] = 1;
                __l_52._M_len = 4;
                __l_52._M_array = local_198;
                std::vector<int,_std::allocator<int>_>::vector(&local_238,__l_52,&local_23a);
                Lattice::addFace(pLVar1,vertexIndex,SUB84(local_188,0) + 2,&local_180,&local_238);
                if (local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_180);
                lVar7 = -0x80;
                plVar6 = local_1a8;
                do {
                  if (plVar6 != (long *)plVar6[-2]) {
                    operator_delete((long *)plVar6[-2],*plVar6 + 1);
                  }
                  plVar6 = plVar6 + -4;
                  lVar7 = lVar7 + 0x20;
                } while (lVar7 != 0);
                local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"xyz","");
                local_1f8[0] = local_1e8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"yz","");
                pLVar1 = local_220;
                local_1d8[0] = local_1c8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"yz","");
                local_1b8[0] = local_1a8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"xyz","");
                __l_53._M_len = 4;
                __l_53._M_array = &local_218;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_180,__l_53,&local_239);
                local_198[0] = -1;
                local_198[1] = -1;
                local_198[2] = -1;
                local_198[3] = -1;
                __l_54._M_len = 4;
                __l_54._M_array = local_198;
                std::vector<int,_std::allocator<int>_>::vector(&local_238,__l_54,&local_23a);
                Lattice::addFace(pLVar1,vertexIndex,SUB84(local_188,0) + 3,&local_180,&local_238);
                if (local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_180);
                lVar7 = -0x80;
                plVar6 = local_1a8;
                do {
                  if (plVar6 != (long *)plVar6[-2]) {
                    operator_delete((long *)plVar6[-2],*plVar6 + 1);
                  }
                  plVar6 = plVar6 + -4;
                  lVar7 = lVar7 + 0x20;
                } while (lVar7 != 0);
                local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"xyz","");
                local_1f8[0] = local_1e8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"xy","");
                pLVar1 = local_220;
                local_1d8[0] = local_1c8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"xy","");
                local_1b8[0] = local_1a8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"xyz","");
                __l_55._M_len = 4;
                __l_55._M_array = &local_218;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_180,__l_55,&local_239);
                local_198[0] = 1;
                local_198[1] = 1;
                local_198[2] = 1;
                local_198[3] = 1;
                __l_56._M_len = 4;
                __l_56._M_array = local_198;
                std::vector<int,_std::allocator<int>_>::vector(&local_238,__l_56,&local_23a);
                Lattice::addFace(pLVar1,vertexIndex,SUB84(local_188,0) + 4,&local_180,&local_238);
                if (local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_180);
                lVar7 = -0x80;
                plVar6 = local_1a8;
                do {
                  if (plVar6 != (long *)plVar6[-2]) {
                    operator_delete((long *)plVar6[-2],*plVar6 + 1);
                  }
                  plVar6 = plVar6 + -4;
                  lVar7 = lVar7 + 0x20;
                } while (lVar7 != 0);
                local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"xyz","");
                local_1f8[0] = local_1e8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"xy","");
                pLVar1 = local_220;
                local_1d8[0] = local_1c8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"xy","");
                local_1b8[0] = local_1a8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"xyz","");
                __l_57._M_len = 4;
                __l_57._M_array = &local_218;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_180,__l_57,&local_239);
                iVar9 = SUB84(local_188,0);
                local_198[0] = -1;
                local_198[1] = -1;
                local_198[2] = -1;
                local_198[3] = -1;
                __l_58._M_len = 4;
                __l_58._M_array = local_198;
                std::vector<int,_std::allocator<int>_>::vector(&local_238,__l_58,&local_23a);
                Lattice::addFace(pLVar1,vertexIndex,iVar9 + 5,&local_180,&local_238);
                if (local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_180);
                lVar7 = -0x80;
                plVar6 = local_1a8;
                do {
                  if (plVar6 != (long *)plVar6[-2]) {
                    operator_delete((long *)plVar6[-2],*plVar6 + 1);
                  }
                  plVar6 = plVar6 + -4;
                  lVar7 = lVar7 + 0x20;
                } while (lVar7 != 0);
              }
              dVar10 = (double)(ulong)(iVar9 + 6);
            }
          }
        }
      }
LAB_00126eb1:
      this = (RhombicLattice *)local_220;
      vertexIndex = vertexIndex + 1;
      local_188 = (double)vertexIndex;
      dVar11 = pow((double)local_220->l,3.0);
    } while (local_188 < dVar11);
  }
  return;
}

Assistant:

void RhombicLattice::createFaces()
{
    int faceIndex = 0;
    for (int vertexIndex = 0; vertexIndex < pow(l, 3); ++vertexIndex)
    {
        cartesian4 coordinate = indexToCoordinate(vertexIndex);
        if ((coordinate.x + coordinate.y + coordinate.z) % 2 == 1)
        {
            if (coordinate.z == 0)
            {
                continue;
            }
            else if (coordinate.z % 2 == 1)
            {
                if (coordinate.y == 0)
                {
                    addFace(vertexIndex, faceIndex, {"xyz", "xy", "xy", "xyz"}, {1, 1, 1, 1});
                    ++faceIndex;
                }
                else if (coordinate.x == 0)
                {
                    addFace(vertexIndex, faceIndex, {"xyz", "xy", "xy", "xyz"}, {1, 1, 1, 1});
                    ++faceIndex;
                    if (coordinate.z != l - 1)
                    {
                        addFace(vertexIndex, faceIndex, {"xyz", "xz", "xz", "xyz"}, {1, 1, 1, 1});
                        ++faceIndex;
                    }
                    if (coordinate.z != 1)
                    {
                        addFace(vertexIndex, faceIndex, {"xy", "yz", "yz", "xy"}, {1, -1, -1, 1});
                        ++faceIndex;
                    }
                }
                else if (coordinate.x == l - 1)
                {
                    if (coordinate.y == l - 1)
                    {
                        continue;
                    }
                    addFace(vertexIndex, faceIndex, {"yz", "xz", "xz", "yz"}, {1, -1, -1, 1});
                    ++faceIndex;
                    if (coordinate.z != l - 1)
                    {
                        addFace(vertexIndex, faceIndex, {"xy", "yz", "yz", "xy"}, {-1, 1, 1, -1});
                        ++faceIndex;
                    }
                    if (coordinate.z != 1)
                    {
                        addFace(vertexIndex, faceIndex, {"xyz", "xz", "xz", "xyz"}, {-1, -1, -1, -1});
                        ++faceIndex;
                    }
                }
                else if (coordinate.y == l - 1)
                {
                    addFace(vertexIndex, faceIndex, {"xz", "yz", "yz", "xz"}, {1, -1, -1, 1});
                    ++faceIndex;
                }
                else if (coordinate.x % 2 == 0 && coordinate.y % 2 == 0)
                {
                    if (coordinate.z != l - 1)
                    {
                        addFace(vertexIndex, faceIndex, {"xyz", "xz", "xz", "xyz"}, {1, 1, 1, 1});
                        ++faceIndex;
                        addFace(vertexIndex, faceIndex, {"xy", "yz", "yz", "xy"}, {-1, 1, 1, -1});
                        ++faceIndex;
                    }
                    if (coordinate.z != 1)
                    {
                        addFace(vertexIndex, faceIndex, {"xy", "yz", "yz", "xy"}, {1, -1, -1, 1});
                        ++faceIndex;
                        addFace(vertexIndex, faceIndex, {"xyz", "xz", "xz", "xyz"}, {-1, -1, -1, -1});
                        ++faceIndex;
                    }
                    addFace(vertexIndex, faceIndex, {"xyz", "xy", "xy", "xyz"}, {1, 1, 1, 1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xyz", "xy", "xy", "xyz"}, {-1, -1, -1, -1});
                    ++faceIndex;
                }
                else if (coordinate.x % 2 == 1 && coordinate.y % 2 == 1)
                {
                    if (coordinate.z != l - 1)
                    {
                        addFace(vertexIndex, faceIndex, {"xyz", "xz", "xz", "xyz"}, {1, 1, 1, 1});
                        ++faceIndex;
                        addFace(vertexIndex, faceIndex, {"xy", "yz", "yz", "xy"}, {-1, 1, 1, -1});
                        ++faceIndex;
                    }
                    if (coordinate.z != 1)
                    {
                        addFace(vertexIndex, faceIndex, {"xy", "yz", "yz", "xy"}, {1, -1, -1, 1});
                        ++faceIndex;
                        addFace(vertexIndex, faceIndex, {"xyz", "xz", "xz", "xyz"}, {-1, -1, -1, -1});
                        ++faceIndex;
                    }
                    addFace(vertexIndex, faceIndex, {"xz", "yz", "yz", "xz"}, {1, -1, -1, 1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xz", "yz", "yz", "xz"}, {-1, 1, 1, -1});
                    ++faceIndex;
                }
            }
            else
            {
                if (coordinate.x == 0)
                {
                    addFace(vertexIndex, faceIndex, {"xz", "yz", "yz", "xz"}, {1, -1, -1, 1});
                    ++faceIndex;
                }
                else if (coordinate.y == 0)
                {
                    if (coordinate.x == l - 1)
                    {
                        continue;
                    }
                    addFace(vertexIndex, faceIndex, {"xyz", "xy", "xy", "xyz"}, {1, 1, 1, 1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xyz", "yz", "yz", "xyz"}, {1, 1, 1, 1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xy", "xz", "xz", "xy"}, {1, -1, -1, 1});
                    ++faceIndex;
                }
                else if (coordinate.x == l - 1)
                {
                    addFace(vertexIndex, faceIndex, {"xyz", "xy", "xy", "xyz"}, {-1, -1, -1, -1});
                    ++faceIndex;
                }
                else if (coordinate.y == l - 1)
                {
                    addFace(vertexIndex, faceIndex, {"xz", "yz", "yz", "xz"}, {1, -1, -1, 1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xy", "xz", "xz", "xy"}, {-1, 1, 1, -1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xyz", "yz", "yz", "xyz"}, {-1, -1, -1, -1});
                    ++faceIndex;
                }
                else if (coordinate.x % 2 == 0 && coordinate.y % 2 == 1)
                {
                    addFace(vertexIndex, faceIndex, {"xz", "xy", "xy", "xz"}, {1, -1, -1, 1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xyz", "yz", "yz", "xyz"}, {-1, -1, -1, -1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xyz", "yz", "yz", "xyz"}, {1, 1, 1, 1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xz", "xy", "xy", "xz"}, {-1, 1, 1, -1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xz", "yz", "yz", "xz"}, {1, -1, -1, 1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xz", "yz", "yz", "xz"}, {-1, 1, 1, -1});
                    ++faceIndex;
                }
                else if (coordinate.x % 2 == 1 && coordinate.y % 2 == 0)
                {
                    addFace(vertexIndex, faceIndex, {"xyz", "yz", "yz", "xyz"}, {1, 1, 1, 1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xz", "xy", "xy", "xz"}, {-1, 1, 1, -1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xz", "xy", "xy", "xz"}, {1, -1, -1, 1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xyz", "yz", "yz", "xyz"}, {-1, -1, -1, -1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xyz", "xy", "xy", "xyz"}, {1, 1, 1, 1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xyz", "xy", "xy", "xyz"}, {-1, -1, -1, -1});
                    ++faceIndex;
                }
            }
        }
    }
}